

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_all.cpp
# Opt level: O2

void __thiscall tst_helpers_all::atLeastOnePromiseReject_void(tst_helpers_all *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar3;
  char cVar4;
  bool bVar5;
  PromiseData<void> *pPVar6;
  QThread *p_00;
  QObject *pQVar7;
  QEvent *this_00;
  long lVar8;
  char *pcVar9;
  initializer_list<QtPromise::QPromise<void>_> args;
  PromiseResolver<void> resolver;
  QPromiseBase<void> local_140;
  PromiseResolver<void> resolver_1;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  QPromise<void> p2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_f8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_f0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e8;
  _Any_data local_e0;
  undefined **local_d0;
  PromiseData<void> *local_c8;
  undefined **local_c0;
  PromiseData<void> *local_b8;
  QPromise<void> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a0;
  QPromiseBase<void> local_98;
  QWeakPointer<QObject> local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QPromise<void> p1;
  QPromise<void> p0;
  
  QtPromise::resolve();
  QtPromise::resolve();
  p2.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128920;
  pPVar6 = (PromiseData<void> *)operator_new(0x58);
  (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar6->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e0._M_unused._M_object = &PTR__QPromiseBase_00128980;
  p2.super_QPromiseBase<void>.m_d.d = pPVar6;
  local_e0._8_8_ = pPVar6;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_e0);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_e0);
  if (resolver.m_d.d == (Data *)0x0) {
    local_78.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_78.d = (Data *)resolver;
  }
  local_58.d = (Data *)0x0;
  if ((Data *)local_78.d == (Data *)0x0) {
    local_128._M_unused._M_object = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_128._M_unused._0_8_ = local_78.d;
  }
  local_140._vptr_QPromiseBase = (_func_int **)0x0;
  if ((Data *)local_128._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_128._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_128._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98._vptr_QPromiseBase = (_func_int **)local_128._M_unused._0_8_;
  p_00 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&local_88,p_00);
  if (((local_88.d != (Data *)0x0) &&
      (local_88.value != (QObject *)0x0 &&
       ((local_88.d)->strongref)._q_value.super___atomic_base<int>._M_i != 0)) &&
     (cVar4 = QThread::isFinished(), cVar4 == '\0')) {
    if ((local_88.d == (Data *)0x0) ||
       (((local_88.d)->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
      local_88.value = (QObject *)0x0;
    }
    pQVar7 = (QObject *)QAbstractEventDispatcher::instance((QThread *)local_88.value);
    if ((pQVar7 != (QObject *)0x0) || (cVar4 = QCoreApplication::closingDown(), cVar4 == '\0')) {
      this_00 = (QEvent *)operator_new(0x18);
      QEvent::QEvent(this_00,None);
      *(undefined ***)this_00 = &PTR__Event_001287c8;
      *(void **)(this_00 + 0x10) = local_128._M_unused._M_object;
      if ((Data *)local_128._M_unused._0_8_ != (Data *)0x0) {
        LOCK();
        *(int *)local_128._M_unused._0_8_ = *local_128._M_unused._M_object + 1;
        UNLOCK();
      }
      QCoreApplication::postEvent(pQVar7,this_00,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_88);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_98);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_140);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_58);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  p2.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128980;
  local_e0._8_8_ = p0.super_QPromiseBase<void>.m_d.d;
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e0._M_unused._M_object = &PTR__QPromiseBase_00128980;
  local_c8 = p2.super_QPromiseBase<void>.m_d.d;
  if (p2.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p2.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d0 = &PTR__QPromiseBase_00128980;
  local_b8 = p1.super_QPromiseBase<void>.m_d.d;
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c0 = &PTR__QPromiseBase_00128980;
  args._M_len = 3;
  args._M_array = (iterator)&local_e0;
  QList<QtPromise::QPromise<void>_>::QList((QList<QtPromise::QPromise<void>_> *)&local_128,args);
  QtPromise::all<QList>((QtPromise *)&p,(QList<QtPromise::QPromise<void>_> *)&local_128);
  QArrayDataPointer<QtPromise::QPromise<void>_>::~QArrayDataPointer
            ((QArrayDataPointer<QtPromise::QPromise<void>_> *)&local_128);
  lVar8 = 0x20;
  do {
    QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)((long)&local_e0 + lVar8));
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != -0x10);
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isFulfilled
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  local_128._M_pod_data[0] = 1;
  local_e0._M_pod_data[0] = bVar5;
  bVar5 = QTest::qCompare<bool,bool>
                    ((bool *)local_e0._M_pod_data,(bool *)local_128._M_pod_data,"p0.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                     ,0xae);
  if (bVar5) {
    local_e0._M_pod_data[0] =
         QtPromisePrivate::PromiseDataBase<void,_void_()>::isFulfilled
                   (&(p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    local_128._M_pod_data[0] = 1;
    bVar5 = QTest::qCompare<bool,bool>
                      ((bool *)local_e0._M_pod_data,(bool *)local_128._M_pod_data,"p1.isFulfilled()"
                       ,"true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                       ,0xaf);
    if (bVar5) {
      local_e0._M_pod_data[0] =
           QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                     (&(p2.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
      local_128._M_pod_data[0] = 1;
      bVar5 = QTest::qCompare<bool,bool>
                        ((bool *)local_e0._M_pod_data,(bool *)local_128._M_pod_data,"p2.isPending()"
                         ,"true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                         ,0xb0);
      if (bVar5) {
        local_e0._M_pod_data[0] =
             QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                       (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
        local_128._M_pod_data[0] = 1;
        pcVar9 = 
        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
        ;
        bVar5 = QTest::qCompare<bool,bool>
                          ((bool *)local_e0._M_pod_data,(bool *)local_128._M_pod_data,
                           "p.isPending()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                           ,0xb1);
        if (bVar5) {
          local_58.d = (Data *)0x0;
          local_58.ptr = (char16_t *)0x0;
          local_58.size = 0;
          local_78.d = (Data *)0x0;
          local_78.ptr = (char16_t *)0x0;
          local_78.size = 0;
          local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128920;
          pPVar6 = (PromiseData<void> *)operator_new(0x58);
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                *)0x0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
          *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).m_lock = 0;
          *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).m_settled = 0;
          (pPVar6->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
          *(undefined8 *)&(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
          (pPVar6->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object =
               (void *)0x0;
          QtPromisePrivate::PromiseData<void>::PromiseData(pPVar6);
          LOCK();
          pQVar1 = &(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData;
          (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (pPVar6 != (PromiseData<void> *)0x0) {
            LOCK();
            pQVar1 = &(pPVar6->super_PromiseDataBase<void,_void_()>).super_QSharedData;
            (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_98._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128980;
          local_140.m_d.d = pPVar6;
          local_98.m_d.d = pPVar6;
          QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                    (&resolver_1,(QPromise<void> *)&local_98);
          QtPromise::QPromiseBase<void>::~QPromiseBase(&local_98);
          QVar2 = p.super_QPromiseBase<void>.m_d;
          if (resolver_1.m_d.d == (Data *)0x0) {
            resolver_1.m_d.d =
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
                 (Data *)0x0;
          }
          else {
            LOCK();
            *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
            UNLOCK();
          }
          local_f0.d = (Data *)0x0;
          if (resolver_1.m_d.d == (Data *)0x0) {
            local_a0.d = (Data *)0x0;
          }
          else {
            LOCK();
            (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
            local_a0 = resolver_1.m_d.d;
          }
          local_f8.d = (Data *)0x0;
          local_e8 = resolver_1.m_d.d;
          QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
          create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                    ((function<void_(const_int_&)> *)&local_e0,
                     (PromiseHandler<void,decltype(nullptr),void> *)0x0,&local_e8,
                     (QPromiseResolve<void> *)&local_a0,(QPromiseReject<void> *)pcVar9);
          QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
                    (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
                     (function<void_(const_int_&)> *)&local_e0);
          std::_Function_base::~_Function_base((_Function_base *)&local_e0);
          QVar3.d = local_a0.d;
          QVar2 = p.super_QPromiseBase<void>.m_d;
          resolver.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
               local_e8.d;
          if (local_e8.d != (Data *)0x0) {
            LOCK();
            ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (local_a0.d != (Data *)0x0) {
            LOCK();
            ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_128._M_unused._M_object = (void *)0x0;
          local_128._8_8_ = 0;
          local_118 = (code *)0x0;
          pcStack_110 = (code *)0x0;
          local_128._M_unused._M_object = operator_new(0x18);
          *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
           local_128._M_unused._0_8_ = resolver.m_d.d;
          if (resolver.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
            UNLOCK();
          }
          *(Data **)((long)local_128._M_unused._0_8_ + 8) = QVar3.d;
          if (QVar3.d != (Data *)0x0) {
            LOCK();
            ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          *(QArrayDataPointer<char16_t> **)((long)local_128._M_unused._0_8_ + 0x10) = &local_78;
          pcStack_110 = std::
                        _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                        ::_M_invoke;
          local_118 = std::
                      _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                      ::_M_manager;
          QtPromisePrivate::
          PromiseCatcher<void,waitForError<QString>(QtPromise::QPromise<void>const&,QString_const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QString_const&)#1},QString_const&>
          ::
          create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForError<QString>(QtPromise::QPromise<void>const&,QString_const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QString_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
          ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
                    ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&resolver);
          QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
                    (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
                     (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_128);
          std::_Function_base::~_Function_base((_Function_base *)&local_128);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
          ~QExplicitlySharedDataPointer(&local_a0);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
          ~QExplicitlySharedDataPointer(&local_f8);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
          ~QExplicitlySharedDataPointer(&local_e8);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
          ~QExplicitlySharedDataPointer(&local_f0);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
          ~QExplicitlySharedDataPointer(&resolver_1.m_d);
          local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128980;
          bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                            (&(p.super_QPromiseBase<void>.m_d.d)->
                              super_PromiseDataBase<void,_void_()>);
          if (!bVar5) {
            QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
                      (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
          }
          QtPromise::QPromiseBase<void>::wait((QPromiseBase<void> *)&resolver,&local_140);
          QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver);
          QtPromise::QPromiseBase<void>::~QPromiseBase(&local_140);
          QString::QString((QString *)&resolver,"foo");
          bVar5 = QTest::qCompare((QString *)&local_78,(QString *)&resolver,
                                  "waitForError(p, QString{})","QString{\"foo\"}",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                                  ,0xb2);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          if (bVar5) {
            bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isRejected
                              (&(p2.super_QPromiseBase<void>.m_d.d)->
                                super_PromiseDataBase<void,_void_()>);
            resolver.m_d.d._0_1_ = bVar5;
            local_78.d = (Data *)CONCAT71(local_78.d._1_7_,1);
            QTest::qCompare<bool,bool>
                      ((bool *)&resolver,(bool *)&local_78,"p2.isRejected()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_all.cpp"
                       ,0xb3);
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p2.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p1.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p0.super_QPromiseBase<void>);
  return;
}

Assistant:

void tst_helpers_all::atLeastOnePromiseReject_void()
{
    auto p0 = QtPromise::resolve();
    auto p1 = QtPromise::resolve();
    auto p2 = QtPromise::QPromise<void>{
        [](const QtPromise::QPromiseResolve<void>&, const QtPromise::QPromiseReject<void>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    auto p = QtPromise::all(QVector<QtPromise::QPromise<void>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p2.isRejected(), true);
}